

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

void MaxDiffsForRow(int width,int stride,uint32_t *argb,uint8_t *max_diffs,int used_subtract_green)

{
  uint32_t argb_00;
  uint32_t argb_01;
  uint32_t argb_02;
  uint32_t argb_03;
  int iVar1;
  long in_RCX;
  uint32_t *in_RDX;
  int in_ESI;
  int in_EDI;
  uint32_t in_R8D;
  int x;
  uint32_t right;
  uint32_t left;
  uint32_t down;
  uint32_t up;
  uint32_t current;
  int local_34;
  uint32_t local_30;
  uint32_t up_00;
  
  if (2 < in_EDI) {
    argb_00 = *in_RDX;
    local_30 = in_RDX[1];
    if (in_R8D != 0) {
      argb_00 = AddGreenToBlueAndRed(argb_00);
      local_30 = AddGreenToBlueAndRed(local_30);
    }
    for (local_34 = 1; local_34 < in_EDI + -1; local_34 = local_34 + 1) {
      argb_01 = in_RDX[local_34 - in_ESI];
      argb_02 = in_RDX[in_ESI + local_34];
      argb_03 = in_RDX[local_34 + 1];
      up_00 = local_30;
      if (in_R8D != 0) {
        argb_01 = AddGreenToBlueAndRed(argb_01);
        argb_02 = AddGreenToBlueAndRed(argb_02);
        argb_03 = AddGreenToBlueAndRed(argb_03);
        up_00 = local_30;
      }
      local_30 = argb_03;
      iVar1 = MaxDiffAroundPixel(in_R8D,up_00,argb_01,argb_02,argb_00);
      *(char *)(in_RCX + local_34) = (char)iVar1;
      argb_00 = up_00;
    }
  }
  return;
}

Assistant:

static void MaxDiffsForRow(int width, int stride, const uint32_t* const argb,
                           uint8_t* const max_diffs, int used_subtract_green) {
  uint32_t current, up, down, left, right;
  int x;
  if (width <= 2) return;
  current = argb[0];
  right = argb[1];
  if (used_subtract_green) {
    current = AddGreenToBlueAndRed(current);
    right = AddGreenToBlueAndRed(right);
  }
  // max_diffs[0] and max_diffs[width - 1] are never used.
  for (x = 1; x < width - 1; ++x) {
    up = argb[-stride + x];
    down = argb[stride + x];
    left = current;
    current = right;
    right = argb[x + 1];
    if (used_subtract_green) {
      up = AddGreenToBlueAndRed(up);
      down = AddGreenToBlueAndRed(down);
      right = AddGreenToBlueAndRed(right);
    }
    max_diffs[x] = MaxDiffAroundPixel(current, up, down, left, right);
  }
}